

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

llm_graph_input_attn_no_cache * __thiscall
llm_graph_context::build_attn_inp_no_cache(llm_graph_context *this)

{
  _func_int **pp_Var1;
  llm_graph_input_attn_no_cache *plVar2;
  pointer __p;
  pointer *__ptr;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_18;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_10;
  
  std::make_unique<llm_graph_input_attn_no_cache,llama_hparams_const&,llama_cparams_const&>
            ((llama_hparams *)&local_18,(llama_cparams *)this->hparams);
  pp_Var1 = (_func_int **)
            ggml_new_tensor_2d(this->ctx0,0,(long)this->n_tokens,
                               (long)this->n_tokens + 0x3fU & 0xffffffffffffffc0);
  local_18._M_head_impl[1]._vptr_llm_graph_input_i = pp_Var1;
  ggml_set_input(pp_Var1);
  if (this->cparams->flash_attn == true) {
    pp_Var1 = (_func_int **)ggml_cast(this->ctx0,local_18._M_head_impl[1]._vptr_llm_graph_input_i,1)
    ;
    local_10._M_t.
    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
    super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_18;
  }
  else {
    pp_Var1 = local_18._M_head_impl[1]._vptr_llm_graph_input_i;
    local_10._M_t.
    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
    super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_18._M_head_impl;
  }
  *(_func_int ***)
   ((long)local_10._M_t.
          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
          super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = pp_Var1;
  local_18._M_head_impl = (llm_graph_input_i *)0x0;
  plVar2 = (llm_graph_input_attn_no_cache *)
           llm_graph_result::add_input
                     ((this->res)._M_t.
                      super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                      .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
                      (llm_graph_input_ptr *)&local_10);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_10._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  local_10._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)0x0;
  if (local_18._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  return plVar2;
}

Assistant:

llm_graph_input_attn_no_cache * llm_graph_context::build_attn_inp_no_cache() const {
    auto inp = std::make_unique<llm_graph_input_attn_no_cache>(hparams, cparams);

    // note: there is no KV cache, so the number of KV values is equal to the number of tokens in the batch
    inp->kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_tokens, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    //cb(inp_kq_mask, "KQ_mask", -1);
    ggml_set_input(inp->kq_mask);

    inp->kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->kq_mask, GGML_TYPE_F16) : inp->kq_mask;

    return (llm_graph_input_attn_no_cache *) res->add_input(std::move(inp));
}